

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-player.c
# Opt level: O0

void media_player2_player_proxy_init(MediaPlayer2PlayerProxy *proxy)

{
  MediaPlayer2PlayerProxyPrivate *pMVar1;
  undefined8 uVar2;
  GDBusInterfaceInfo *pGVar3;
  MediaPlayer2PlayerProxy *proxy_local;
  
  pMVar1 = (MediaPlayer2PlayerProxyPrivate *)media_player2_player_proxy_get_instance_private(proxy);
  proxy->priv = pMVar1;
  uVar2 = g_dbus_proxy_get_type();
  uVar2 = g_type_check_instance_cast(proxy,uVar2);
  pGVar3 = media_player2_player_interface_info();
  g_dbus_proxy_set_interface_info(uVar2,pGVar3);
  return;
}

Assistant:

static void
media_player2_player_proxy_init (MediaPlayer2PlayerProxy *proxy)
{
#if GLIB_VERSION_MAX_ALLOWED >= GLIB_VERSION_2_38
  proxy->priv = media_player2_player_proxy_get_instance_private (proxy);
#else
  proxy->priv = G_TYPE_INSTANCE_GET_PRIVATE (proxy, TYPE_MEDIA_PLAYER2_PLAYER_PROXY, MediaPlayer2PlayerProxyPrivate);
#endif

  g_dbus_proxy_set_interface_info (G_DBUS_PROXY (proxy), media_player2_player_interface_info ());
}